

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O2

Aig_Obj_t *
createAndGateForMonotonicityVerification
          (Aig_Man_t *pNewAig,Vec_Ptr_t *vDisjunctionSignals,Vec_Ptr_t *vDisjunctionLo,
          Aig_Obj_t *pendingLo,Aig_Obj_t *pendingSignal)

{
  Aig_Obj_t *p0;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p0_00;
  int i;
  
  p0_00 = pNewAig->pConst1;
  p0 = Aig_And(pNewAig,pendingLo,pendingSignal);
  for (i = 0; i < vDisjunctionSignals->nSize; i = i + 1) {
    pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(vDisjunctionSignals,i);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vDisjunctionLo,i);
    pAVar2 = Aig_And(pNewAig,p0,pAVar2);
    pAVar1 = Aig_Or(pNewAig,(Aig_Obj_t *)((ulong)pAVar2 ^ 1),pAVar1);
    p0_00 = Aig_And(pNewAig,p0_00,pAVar1);
  }
  return p0_00;
}

Assistant:

Aig_Obj_t *createAndGateForMonotonicityVerification(
                Aig_Man_t *pNewAig,
                Vec_Ptr_t *vDisjunctionSignals,
                Vec_Ptr_t *vDisjunctionLo,
                Aig_Obj_t *pendingLo,
                Aig_Obj_t *pendingSignal
                )
{
    Aig_Obj_t *pObjBigAnd, *pObj, *pObjLo, *pObjImply;
    Aig_Obj_t *pObjPendingAndPendingLo;
    int i;

    pObjBigAnd = Aig_ManConst1( pNewAig );
    pObjPendingAndPendingLo = Aig_And( pNewAig, pendingLo, pendingSignal );
    Vec_PtrForEachEntry( Aig_Obj_t *, vDisjunctionSignals, pObj, i )
    {
        pObjLo = (Aig_Obj_t *)Vec_PtrEntry( vDisjunctionLo, i );    
        pObjImply = Aig_Or( pNewAig, Aig_Not(Aig_And( pNewAig, pObjPendingAndPendingLo, pObjLo)),
                    pObj );
        pObjBigAnd = Aig_And( pNewAig, pObjBigAnd, pObjImply );
    }
    return pObjBigAnd;
}